

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O0

void nhr_request_connect_to_host(nhr_request_conflict r)

{
  nhr_bool nVar1;
  int iVar2;
  time_t tVar3;
  addrinfo *__ai;
  int local_28;
  int local_24;
  int retry_number;
  nhr_socket_t sock;
  addrinfo *p;
  addrinfo *result;
  nhr_request_conflict r_local;
  
  local_24 = -1;
  local_28 = 0;
  tVar3 = time((time_t *)0x0);
  r->last_time = tVar3;
  __ai = nhr_request_connect_getaddr_info(r);
  nVar1 = nhr_request_check_timeout(r);
  if ((nVar1 != '\0') && (__ai != (addrinfo *)0x0)) {
    while (local_28 = local_28 + 1, _retry_number = __ai, local_28 < 5 && local_24 == -1) {
      for (; _retry_number != (addrinfo *)0x0; _retry_number = _retry_number->ai_next) {
        tVar3 = time((time_t *)0x0);
        r->last_time = tVar3;
        local_24 = socket(_retry_number->ai_family,_retry_number->ai_socktype,
                          _retry_number->ai_protocol);
        if (local_24 != -1) {
          nhr_request_set_option(local_24,4,1);
          nhr_request_set_option(local_24,9,1);
          iVar2 = connect(local_24,(sockaddr *)_retry_number->ai_addr,_retry_number->ai_addrlen);
          if (iVar2 == 0) {
            r->socket = local_24;
            fcntl(r->socket,4,0x800);
            break;
          }
          close(local_24);
        }
        nVar1 = nhr_request_check_timeout(r);
        if (nVar1 == '\0') {
          return;
        }
      }
      if (local_24 == -1) {
        nhr_thread_sleep(200);
      }
    }
    freeaddrinfo((addrinfo *)__ai);
    if (r->socket == -1) {
      r->error_code = nhr_error_code_failed_connect_to_host;
      nhr_request_set_command(r,6);
    }
    else {
      nhr_request_set_command(r,2);
    }
  }
  return;
}

Assistant:

void nhr_request_connect_to_host(nhr_request r) {
	struct addrinfo * result = NULL;
	struct addrinfo * p = NULL;
	nhr_socket_t sock = NHR_INVALID_SOCKET;
	int retry_number = 0;
#if defined(NHR_OS_WINDOWS)
	unsigned long iMode = 0;
#endif

	r->last_time = time(NULL);
	result = nhr_request_connect_getaddr_info(r);
	if (!nhr_request_check_timeout(r)) {
		return; // error already exists
	}
	if (!result) {
		return; // error already exists
	}

	while ((++retry_number < NHR_CONNECT_ATTEMPS) && (sock == NHR_INVALID_SOCKET)) {
		for (p = result; p != NULL; p = p->ai_next) {
			r->last_time = time(NULL);
			sock = socket(p->ai_family, p->ai_socktype, p->ai_protocol);
			if (sock != NHR_INVALID_SOCKET) {
				nhr_request_set_option(sock, SO_ERROR, 1); // When an error occurs on a socket, set error variable so_error and notify process
				nhr_request_set_option(sock, SO_KEEPALIVE, 1); // Periodically test if connection is alive

				if (connect(sock, p->ai_addr, p->ai_addrlen) == 0) {
					r->socket = sock;
#if defined(NHR_OS_WINDOWS)
					iMode = 1; // If iMode != 0, non-blocking mode is enabled.
					ioctlsocket(r->socket, FIONBIO, &iMode);
#else
					fcntl(r->socket, F_SETFL, O_NONBLOCK);
#endif
					break;
				}
				NHR_SOCK_CLOSE(sock);
			}
			if (!nhr_request_check_timeout(r)) {
				return; // error already exists
			}
		}
		if (sock == NHR_INVALID_SOCKET) {
			nhr_thread_sleep(NHR_CONNECT_RETRY_DELAY);
		}
	}

	freeaddrinfo(result);

	if (r->socket == NHR_INVALID_SOCKET) {
#if defined(NHR_OS_WINDOWS)
		WSACleanup();
#endif
		r->error_code = nhr_error_code_failed_connect_to_host;
		nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
	} else {
		nhr_request_set_command(r, NHR_COMMAND_SEND_RAW_REQUEST);
	}
}